

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_sgemm.h
# Opt level: O3

void ncnn::conv_im2col_sgemm_transform_kernel_sse
               (Mat *_kernel,Mat *kernel_tm,int inch,int outch,int kernel_size)

{
  void *pvVar1;
  size_t sVar2;
  size_t sVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  ulong uVar7;
  undefined4 *puVar8;
  int iVar9;
  uint uVar10;
  long lVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  long lVar15;
  
  iVar6 = outch + 3;
  if (-1 < outch) {
    iVar6 = outch;
  }
  iVar14 = 0;
  Mat::create(kernel_tm,kernel_size * 4,inch,outch + (iVar6 >> 2) * -3,4,(Allocator *)0x0);
  if (0 < outch >> 2) {
    iVar5 = kernel_size * inch;
    pvVar1 = kernel_tm->data;
    sVar2 = kernel_tm->cstep;
    sVar3 = kernel_tm->elemsize;
    iVar9 = iVar5 * 3;
    iVar6 = iVar5 * 4;
    iVar12 = iVar5 * 2;
    uVar7 = 0;
    iVar13 = iVar5;
    do {
      if (0 < iVar5) {
        puVar8 = (undefined4 *)(sVar2 * sVar3 * uVar7 + (long)pvVar1);
        lVar15 = 0;
        do {
          *puVar8 = *(undefined4 *)((long)&_kernel->data + lVar15 * 4 + (long)iVar14 * 4);
          puVar8[1] = *(undefined4 *)((long)&_kernel->data + lVar15 * 4 + (long)iVar13 * 4);
          puVar8[2] = *(undefined4 *)((long)&_kernel->data + lVar15 * 4 + (long)iVar12 * 4);
          puVar8[3] = *(undefined4 *)((long)&_kernel->data + lVar15 * 4 + (long)iVar9 * 4);
          lVar15 = lVar15 + 1;
          puVar8 = puVar8 + 4;
        } while (iVar5 != (int)lVar15);
      }
      uVar7 = uVar7 + 1;
      iVar9 = iVar9 + iVar6;
      iVar12 = iVar12 + iVar6;
      iVar13 = iVar13 + iVar6;
      iVar14 = iVar14 + iVar6;
    } while (uVar7 != (uint)(outch >> 2));
  }
  if ((outch & 0xfffffffcU) != outch) {
    iVar6 = kernel_size * inch;
    pvVar1 = kernel_tm->data;
    sVar2 = kernel_tm->cstep;
    sVar3 = kernel_tm->elemsize;
    lVar15 = (long)(int)(outch & 0xfffffffcU);
    iVar14 = ((uint)outch >> 2) * iVar6 * 4;
    do {
      if (0 < iVar6) {
        uVar4 = (uint)lVar15;
        uVar10 = uVar4 + 3;
        if (-1 < (int)uVar4) {
          uVar10 = uVar4;
        }
        lVar11 = 0;
        do {
          *(undefined4 *)
           ((long)pvVar1 +
           lVar11 * 4 +
           (long)(int)(((int)uVar10 >> 2) + (uVar4 - (uVar10 & 0xfffffffc))) * sVar2 * sVar3) =
               *(undefined4 *)((long)&_kernel->data + lVar11 * 4 + (long)iVar14 * 4);
          lVar11 = lVar11 + 1;
        } while (iVar6 != (int)lVar11);
      }
      lVar15 = lVar15 + 1;
      iVar14 = iVar14 + iVar6;
    } while (lVar15 < outch);
  }
  return;
}

Assistant:

static void conv_im2col_sgemm_transform_kernel_sse(const Mat& _kernel, Mat& kernel_tm, int inch, int outch, int kernel_size)
{
    const float* kernel = _kernel;

    // kernel memory packed 4 x 4
    kernel_tm.create(4*kernel_size, inch, outch/4 + outch%4);
    
    int nn_outch = 0;
    int remain_outch_start = 0;

    nn_outch = outch >> 2;
    remain_outch_start = nn_outch << 2;

    for (int pp=0; pp<nn_outch; pp++)
    {
        int p = pp * 4;

        const float* k0 = kernel + (p+0)*inch*kernel_size;
        const float* k1 = kernel + (p+1)*inch*kernel_size;
        const float* k2 = kernel + (p+2)*inch*kernel_size;
        const float* k3 = kernel + (p+3)*inch*kernel_size;

        float* ktmp = kernel_tm.channel(p/4);

        for (int q=0; q<inch*kernel_size; q++)
        {
            ktmp[0] = k0[0];
            ktmp[1] = k1[0];
            ktmp[2] = k2[0];
            ktmp[3] = k3[0];
            ktmp += 4;

            k0 += 1;
            k1 += 1;
            k2 += 1;
            k3 += 1;
        }
    }
    
    for (int p=remain_outch_start; p<outch; p++)
    {
        const float* k0 = kernel + (p+0)*inch*kernel_size;

        float* ktmp = kernel_tm.channel(p/4 + p%4);

        for (int q=0; q<inch*kernel_size; q++)
        {
            ktmp[0] = k0[0];
            ktmp++;
            k0++;
        }
    }
}